

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O1

int64_t __thiscall
aeron::DriverProxy::removeDestination
          (DriverProxy *this,int64_t publicationRegistrationId,string *channel)

{
  long *plVar1;
  int64_t correlationId;
  long local_38;
  int64_t local_30;
  anon_class_32_4_88066e9b local_28;
  
  local_28.correlationId = &local_38;
  local_28.publicationRegistrationId = &local_30;
  LOCK();
  plVar1 = (long *)(this->m_toDriverCommandBuffer->m_buffer->m_buffer +
                   this->m_toDriverCommandBuffer->m_correlationIdCounterIndex);
  local_38 = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  local_30 = publicationRegistrationId;
  local_28.this = this;
  local_28.channel = channel;
  writeCommandToDriver<aeron::DriverProxy::removeDestination(long,std::__cxx11::string_const&)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (this,&local_28);
  return local_38;
}

Assistant:

std::int64_t removeDestination(std::int64_t publicationRegistrationId, const std::string& channel)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            DestinationMessageFlyweight removeMessage(buffer, 0);

            removeMessage.clientId(m_clientId);
            removeMessage.registrationId(publicationRegistrationId);
            removeMessage.correlationId(correlationId);
            removeMessage.channel(channel);

            length = removeMessage.length();

            return ControlProtocolEvents::REMOVE_DESTINATION;
        });

        return correlationId;
    }